

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfragmentmap_p.h
# Opt level: O0

void __thiscall
QFragmentMapData<QTextBlockData>::rotateRight(QFragmentMapData<QTextBlockData> *this,uint x)

{
  uint index;
  uint index_00;
  quint32 qVar1;
  quint32 qVar2;
  QTextBlockData *pQVar3;
  uint in_ESI;
  anon_union_8_2_e778645c_for_QFragmentMapData<QTextBlockData>_1 *in_RDI;
  uint field;
  uint p;
  uint y;
  uint local_18;
  
  pQVar3 = F((QFragmentMapData<QTextBlockData> *)in_RDI,in_ESI);
  index = (pQVar3->super_QFragment<3>).left;
  pQVar3 = F((QFragmentMapData<QTextBlockData> *)in_RDI,in_ESI);
  index_00 = (pQVar3->super_QFragment<3>).parent;
  if (index == 0) {
    pQVar3 = F((QFragmentMapData<QTextBlockData> *)in_RDI,in_ESI);
    (pQVar3->super_QFragment<3>).left = 0;
  }
  else {
    pQVar3 = F((QFragmentMapData<QTextBlockData> *)in_RDI,index);
    qVar1 = (pQVar3->super_QFragment<3>).right;
    pQVar3 = F((QFragmentMapData<QTextBlockData> *)in_RDI,in_ESI);
    (pQVar3->super_QFragment<3>).left = qVar1;
    pQVar3 = F((QFragmentMapData<QTextBlockData> *)in_RDI,index);
    if ((pQVar3->super_QFragment<3>).right != 0) {
      pQVar3 = F((QFragmentMapData<QTextBlockData> *)in_RDI,index);
      pQVar3 = F((QFragmentMapData<QTextBlockData> *)in_RDI,(pQVar3->super_QFragment<3>).right);
      (pQVar3->super_QFragment<3>).parent = in_ESI;
    }
    pQVar3 = F((QFragmentMapData<QTextBlockData> *)in_RDI,index);
    (pQVar3->super_QFragment<3>).right = in_ESI;
    pQVar3 = F((QFragmentMapData<QTextBlockData> *)in_RDI,index);
    (pQVar3->super_QFragment<3>).parent = index_00;
  }
  if (index_00 == 0) {
    in_RDI->head->root = index;
  }
  else {
    pQVar3 = F((QFragmentMapData<QTextBlockData> *)in_RDI,index_00);
    if (in_ESI == (pQVar3->super_QFragment<3>).right) {
      pQVar3 = F((QFragmentMapData<QTextBlockData> *)in_RDI,index_00);
      (pQVar3->super_QFragment<3>).right = index;
    }
    else {
      pQVar3 = F((QFragmentMapData<QTextBlockData> *)in_RDI,index_00);
      (pQVar3->super_QFragment<3>).left = index;
    }
  }
  pQVar3 = F((QFragmentMapData<QTextBlockData> *)in_RDI,in_ESI);
  (pQVar3->super_QFragment<3>).parent = index;
  for (local_18 = 0; local_18 < 3; local_18 = local_18 + 1) {
    pQVar3 = F((QFragmentMapData<QTextBlockData> *)in_RDI,index);
    qVar1 = (pQVar3->super_QFragment<3>).size_left_array[local_18];
    pQVar3 = F((QFragmentMapData<QTextBlockData> *)in_RDI,index);
    qVar2 = (pQVar3->super_QFragment<3>).size_array[local_18];
    pQVar3 = F((QFragmentMapData<QTextBlockData> *)in_RDI,in_ESI);
    (pQVar3->super_QFragment<3>).size_left_array[local_18] =
         (pQVar3->super_QFragment<3>).size_left_array[local_18] - (qVar1 + qVar2);
  }
  return;
}

Assistant:

void QFragmentMapData<Fragment>::rotateRight(uint x)
{
    uint y = F(x).left;
    uint p = F(x).parent;

    if (y) {
        F(x).left = F(y).right;
        if (F(y).right)
            F(F(y).right).parent = x;
        F(y).right = x;
        F(y).parent = p;
    } else {
        F(x).left = 0;
    }
    if (!p) {
        Q_ASSERT(head->root == x);
        head->root = y;
    }
    else if (x == F(p).right)
        F(p).right = y;
    else
        F(p).left = y;
    F(x).parent = y;
    for (uint field = 0; field < Fragment::size_array_max; ++field)
        F(x).size_left_array[field] -= F(y).size_left_array[field] + F(y).size_array[field];
}